

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_cell_has_face(REF_GRID ref_grid,REF_INT *face_nodes,REF_BOOL *has_face)

{
  uint uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  bool bVar3;
  REF_INT cell0;
  REF_INT cell1;
  undefined8 local_38;
  
  *has_face = 0;
  uVar2 = 8;
  local_38 = in_RAX;
  while( true ) {
    uVar1 = ref_cell_with_face(ref_grid->cell[uVar2],face_nodes,(REF_INT *)&local_38,
                               (REF_INT *)((long)&local_38 + 4));
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x151,
             "ref_grid_cell_has_face",(ulong)uVar1,"face search failed");
      return uVar1;
    }
    *has_face = (uint)((int)local_38 != -1);
    if ((int)local_38 != -1) break;
    bVar3 = 0xe < uVar2;
    uVar2 = uVar2 + 1;
    if (bVar3) {
      return 0;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_has_face(REF_GRID ref_grid,
                                          REF_INT *face_nodes,
                                          REF_BOOL *has_face) {
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT cell0, cell1;

  *has_face = REF_FALSE;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1),
        "face search failed");
    *has_face = (REF_EMPTY != cell0);
    if (*has_face) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}